

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O3

int anon_unknown.dwarf_747b::RtMidi_getversion(lua_State *L)

{
  string str;
  long *local_30;
  undefined8 local_28;
  long local_20 [2];
  
  RtMidi::getVersion_abi_cxx11_();
  lua_pushlstring(L,local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return 1;
}

Assistant:

int RtMidi_getversion(lua_State *L) {
	auto str = RtMidi::getVersion();
	lua_pushlstring(L, str.c_str(), str.size());
	return 1;
}